

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

map * map_init(void)

{
  int iVar1;
  map_entry **ppmVar2;
  map *map;
  
  map = (map *)malloc(0x60);
  if (map == (map *)0x0) {
    map = (map *)0x0;
  }
  else {
    map->length = 4;
    map->bucket_count = 0;
    ppmVar2 = (map_entry **)calloc((ulong)map->length,0x18);
    map->entries = ppmVar2;
    if (map->entries == (map_entry **)0x0) {
      map = (map *)0x0;
    }
    else {
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&map->mutex,(pthread_mutexattr_t *)0x0);
      if (iVar1 == 0) {
        map->hash_function = default_hash_function;
        map->key_size_function = default_key_size_function;
        map->key_compare_function = default_key_compare_function;
        map->free_function = (map_entry_free_function_t)0x0;
        map->setting_flags = MAP_FLAG_IGNORE_THRESHOLDS_EMPTY;
        map->event_flags = EVENT_FLAG_NORMAL;
      }
      else {
        map = (map *)0x0;
      }
    }
  }
  return map;
}

Assistant:

struct map *map_init(void)
{
        struct map *map = malloc(sizeof(struct map));

        if (map == NULL) {
                return NULL;
        }

        map->length = MAP_MIN_LENGTH;
        map->bucket_count = 0;
        map->entries = calloc(map->length, sizeof(struct map_entry));

        if (map->entries == NULL) {
                return NULL;
        }

        if (pthread_mutex_init(&map->mutex, NULL) != 0) {
                return NULL;
        }

        map->hash_function = default_hash_function;
        map->key_size_function = default_key_size_function;
        map->key_compare_function = default_key_compare_function;
        map->free_function = NULL;
        map->setting_flags = MAP_FLAG_IGNORE_THRESHOLDS_EMPTY;
        map->event_flags = EVENT_FLAG_NORMAL;

        return map;
}